

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<short,_duckdb::string_t> *state,short x_data,string_t y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  char *pcVar2;
  undefined6 in_register_00000012;
  long lVar3;
  ArgMinMaxBase<duckdb::LessThan,false> AVar4;
  string_t new_value;
  anon_union_16_2_67f50693_for_value local_30;
  
  local_30._0_8_ = CONCAT62(in_register_00000012,x_data);
  lVar3 = y_data.value._8_8_;
  local_30.pointer.ptr = (char *)y_data.value._0_8_;
  pcVar2 = local_30.pointer.ptr;
  if ((**(long **)(lVar3 + 0x10) != 0) &&
     (pcVar2 = *(char **)(lVar3 + 0x20),
     (*(ulong *)(**(long **)(lVar3 + 0x10) + ((ulong)pcVar2 >> 6) * 8) >> ((ulong)pcVar2 & 0x3f) & 1
     ) == 0)) {
    return;
  }
  bVar1 = string_t::StringComparisonOperators::GreaterThan
                    ((string_t *)(this + 8),(string_t *)&local_30.pointer);
  if (!bVar1) {
    return;
  }
  if (**(long **)(lVar3 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    pcVar2 = *(char **)(lVar3 + 0x18);
    AVar4 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(**(long **)(lVar3 + 8) + ((ulong)pcVar2 >> 6) * 8) >>
              ((ulong)pcVar2 & 0x3f) & 1) == 0);
    this[1] = AVar4;
    if ((bool)AVar4) goto LAB_019d3cb3;
  }
  *(short *)(this + 2) = (short)state;
LAB_019d3cb3:
  new_value.value.pointer.ptr = pcVar2;
  new_value.value._0_8_ = local_30.pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 8),(string_t *)local_30._0_8_,new_value);
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}